

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O1

void __thiscall
Assimp::IRRImporter::GenerateGraph
          (IRRImporter *this,Node *root,aiNode *rootOut,aiScene *scene,BatchLoader *batch,
          vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *anims,
          vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *attach,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials,uint *defMatIdx)

{
  pointer *ppAVar1;
  float *pfVar2;
  pointer ppaVar3;
  pointer ppaVar4;
  iterator __position;
  aiMesh *paVar5;
  pointer ppVar6;
  aiColor4D *paVar7;
  uint a;
  uint uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  Logger *pLVar10;
  uint *puVar11;
  ulong uVar12;
  aiNode **ppaVar13;
  aiNode *this_00;
  ulong uVar14;
  long lVar15;
  int iVar16;
  aiTextureMapping mode;
  char *message;
  uint uVar17;
  IRRImporter *pIVar18;
  aiMaterial *paVar19;
  pointer ppVar20;
  float fVar21;
  float fVar22;
  undefined4 extraout_XMM0_Db;
  float fVar23;
  float fVar24;
  int idx;
  float fStack_a4;
  undefined8 uStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  float local_84;
  float local_80;
  float local_7c;
  undefined8 local_78;
  BatchLoader *local_60;
  IRRImporter *local_58;
  aiScene *local_50;
  _func_int **local_48;
  long local_38;
  
  ppaVar3 = (meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppaVar4 = (meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_60 = batch;
  local_58 = this;
  local_50 = scene;
  switch(root->type) {
  case CUBE:
    _idx = (pointer)StandardShapes::MakeMesh(StandardShapes::MakeHexahedron);
    pIVar18 = (IRRImporter *)meshes;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)meshes,(aiMesh **)&idx);
    fVar21 = root->sphereRadius;
    (root->scaling).x = (root->scaling).x * fVar21;
    (root->scaling).y = (root->scaling).y * fVar21;
    (root->scaling).z = fVar21 * (root->scaling).z;
    CopyMaterial(pIVar18,materials,&root->materials,defMatIdx,
                 (meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1]);
    paVar19 = (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1];
    mode = aiTextureMapping_BOX;
    break;
  case MESH:
  case ANIMMESH:
    if ((root->meshPath)._M_string_length != 0) {
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)BatchLoader::GetImport(batch,root->id);
      if (paVar9 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        pLVar10 = DefaultLogger::get();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                       "IRR: Unable to load external file: ",&root->meshPath);
        Logger::error(pLVar10,_idx);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_idx != &local_98) {
          operator_delete(_idx,local_98._M_allocated_capacity + 1);
        }
      }
      else {
        __position._M_current =
             (attach->
             super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        _idx = (pointer)paVar9;
        uStack_a0 = rootOut;
        if (__position._M_current ==
            (attach->
            super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
          _M_realloc_insert<Assimp::AttachmentInfo>(attach,__position,(AttachmentInfo *)&idx);
        }
        else {
          (__position._M_current)->scene = (aiScene *)paVar9;
          (__position._M_current)->attachToNode = rootOut;
          ppAVar1 = &(attach->
                     super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        if ((long)(root->materials).
                  super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(root->materials).
                  super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4 ==
            (ulong)*(uint *)(paVar9->_M_local_buf + 0x20)) {
          if (*(uint *)(paVar9->_M_local_buf + 0x20) != 0) {
            lVar15 = 0;
            uVar12 = 0;
            do {
              paVar19 = *(aiMaterial **)
                         ((long)*(aiMaterial ***)(paVar9->_M_local_buf + 0x28) + lVar15);
              if (paVar19 != (aiMaterial *)0x0) {
                aiMaterial::~aiMaterial(paVar19);
                operator_delete(paVar19,0x10);
              }
              *(undefined8 *)((long)*(aiMaterial ***)(paVar9->_M_local_buf + 0x28) + lVar15) =
                   *(undefined8 *)
                    ((long)&((root->materials).
                             super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first + lVar15 * 2);
              uVar12 = uVar12 + 1;
              lVar15 = lVar15 + 8;
            } while (uVar12 < *(uint *)(paVar9->_M_local_buf + 0x20));
          }
          if (*(uint *)(paVar9->_M_local_buf + 0x10) != 0) {
            uVar12 = 0;
            do {
              paVar5 = (*(aiMesh ***)(paVar9->_M_local_buf + 0x18))[uVar12];
              ppVar6 = (root->materials).
                       super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar20 = ppVar6 + paVar5->mMaterialIndex;
              paVar19 = ppVar6[paVar5->mMaterialIndex].first;
              paVar7 = paVar5->mColors[0];
              uVar17 = paVar5->mNumVertices;
              if ((uVar17 != 0 && paVar7 != (aiColor4D *)0x0) && ((ppVar20->second & 1) != 0)) {
                if (1 < uVar17) {
                  lVar15 = 0x10;
                  do {
                    fVar21 = *(float *)((long)&paVar7->a + lVar15);
                    pfVar2 = (float *)((long)paVar7 + lVar15 + -4);
                    if ((fVar21 != *pfVar2) || (NAN(fVar21) || NAN(*pfVar2))) goto LAB_004548c2;
                    lVar15 = lVar15 + 0x10;
                  } while ((ulong)uVar17 << 4 != lVar15);
                }
                local_78 = ppVar20;
                pLVar10 = DefaultLogger::get();
                Logger::info(pLVar10,"IRR: Replacing mesh vertex alpha with common opacity");
                if (paVar5->mNumVertices != 0) {
                  lVar15 = 0xc;
                  uVar14 = 0;
                  do {
                    *(undefined4 *)((long)&paVar5->mColors[0]->r + lVar15) = 0x3f800000;
                    uVar14 = uVar14 + 1;
                    lVar15 = lVar15 + 0x10;
                  } while (uVar14 < paVar5->mNumVertices);
                }
                aiMaterial::AddBinaryProperty
                          (paVar19,&paVar5->mColors[0]->a,4,"$mat.opacity",0,0,aiPTI_Float);
                ppVar20 = local_78;
              }
LAB_004548c2:
              if ((paVar5->mTextureCoords[1] != (aiVector3D *)0x0) && (paVar5->mNumVertices != 0)) {
                idx = 1;
                uVar17 = 1;
                if (((ppVar20->second & 0x10002) != 0) ||
                   (uVar17 = 6, (ppVar20->second >> 8 & 1) != 0)) {
                  aiMaterial::AddBinaryProperty(paVar19,&idx,4,"$tex.uvwsrc",uVar17,0,aiPTI_Integer)
                  ;
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < *(uint *)(paVar9->_M_local_buf + 0x10));
          }
        }
        else {
          pLVar10 = DefaultLogger::get();
          Logger::warn(pLVar10,
                       "IRR: Failed to match imported materials with the materials found in the IRR scene file"
                      );
        }
      }
    }
    goto switchD_004543f3_caseD_4;
  case SKYBOX:
    if (0x5f < (ulong)((long)(root->materials).
                             super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(root->materials).
                            super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve
                (materials,
                 ((long)(materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)
                        ._M_impl.super__Vector_impl_data._M_start >> 3) + 6);
      lVar15 = 0;
      do {
        std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::insert
                  (materials,
                   (const_iterator)
                   (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (value_type *)
                   ((long)&((root->materials).
                            super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first + lVar15));
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x60);
      pIVar18 = (IRRImporter *)&stack0xffffffffffffffb8;
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::vector
                ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&stack0xffffffffffffffb8,
                 materials);
      BuildSkybox(pIVar18,meshes,
                  (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&stack0xffffffffffffffb8);
      if (local_48 != (_func_int **)0x0) {
        operator_delete(local_48,local_38 - (long)local_48);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                     "IRR.SkyBox_",&root->name);
      std::__cxx11::string::operator=((string *)&root->name,(string *)&idx);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_idx != &local_98) {
        operator_delete(_idx,local_98._M_allocated_capacity + 1);
      }
      pLVar10 = DefaultLogger::get();
      Logger::info(pLVar10,
                   "IRR: Loading skybox, this will require special handling to be displayed correctly"
                  );
      goto switchD_004543f3_caseD_4;
    }
    pLVar10 = DefaultLogger::get();
    message = "IRR: There should be six materials for a skybox";
    goto LAB_00454602;
  default:
    goto switchD_004543f3_caseD_4;
  case TERRAIN:
    pLVar10 = DefaultLogger::get();
    message = "IRR: Unsupported node - TERRAIN";
LAB_00454602:
    Logger::error(pLVar10,message);
    goto switchD_004543f3_caseD_4;
  case SPHERE:
    uVar8 = root->spherePolyCountY * root->spherePolyCountX;
    uVar17 = 2;
    if (99 < uVar8) {
      uVar17 = 4 - (uVar8 < 300);
    }
    _idx = (pointer)StandardShapes::MakeMesh(uVar17,StandardShapes::MakeSphere);
    pIVar18 = (IRRImporter *)meshes;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)meshes,(aiMesh **)&idx);
    fVar21 = root->sphereRadius * 0.5;
    (root->scaling).x = (root->scaling).x * fVar21;
    (root->scaling).y = (root->scaling).y * fVar21;
    (root->scaling).z = fVar21 * (root->scaling).z;
    CopyMaterial(pIVar18,materials,&root->materials,defMatIdx,
                 (meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1]);
    paVar19 = (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1];
    mode = aiTextureMapping_SPHERE;
  }
  uStack_a0 = (aiNode *)CONCAT44(uStack_a0._4_4_,0xbf800000);
  _idx = (pointer)0x0;
  SetupMapping(paVar19,mode,(aiVector3D *)&idx);
switchD_004543f3_caseD_4:
  iVar16 = (int)((ulong)((long)ppaVar3 - (long)ppaVar4) >> 3);
  uVar17 = (int)((ulong)((long)(meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3) - iVar16;
  if (uVar17 != 0) {
    rootOut->mNumMeshes = uVar17;
    puVar11 = (uint *)operator_new__((ulong)uVar17 << 2);
    rootOut->mMeshes = puVar11;
    uVar12 = 0;
    do {
      rootOut->mMeshes[uVar12] = (int)uVar12 + iVar16;
      uVar12 = uVar12 + 1;
    } while (uVar12 < rootOut->mNumMeshes);
  }
  uVar12 = (root->name)._M_string_length;
  if (uVar12 < 0x400) {
    (rootOut->mName).length = (ai_uint32)uVar12;
    memcpy((rootOut->mName).data,(root->name)._M_dataplus._M_p,uVar12);
    (rootOut->mName).data[uVar12] = '\0';
  }
  fVar21 = (root->rotation).x * 0.017453292;
  local_78 = (pointer)CONCAT44(local_78._4_4_,(root->rotation).y * 0.017453292);
  fVar23 = (root->rotation).z * 0.017453292;
  local_7c = cosf(fVar21);
  fVar21 = sinf(fVar21);
  local_80 = cosf((float)local_78);
  fVar22 = sinf((float)local_78);
  local_78 = (pointer)CONCAT44(extraout_XMM0_Db,fVar22);
  local_84 = cosf(fVar23);
  fVar22 = sinf(fVar23);
  (rootOut->mTransformation).a1 = local_80 * local_84;
  fVar23 = (float)local_78 * local_84 * fVar21 - local_7c * fVar22;
  (rootOut->mTransformation).a2 = fVar23;
  (rootOut->mTransformation).a3 = fVar22 * fVar21 + local_7c * (float)local_78 * local_84;
  (rootOut->mTransformation).b1 = local_80 * fVar22;
  fVar24 = local_84 * local_7c + fVar21 * fVar22 * (float)local_78;
  (rootOut->mTransformation).b2 = fVar24;
  (rootOut->mTransformation).b3 = fVar22 * (float)local_78 * local_7c - fVar21 * local_84;
  (rootOut->mTransformation).c1 = -(float)local_78;
  (rootOut->mTransformation).c2 = fVar21 * local_80;
  (rootOut->mTransformation).c3 = local_7c * local_80;
  (rootOut->mTransformation).a1 = local_80 * local_84 * (root->scaling).x;
  (rootOut->mTransformation).b1 = local_80 * fVar22 * (root->scaling).x;
  (rootOut->mTransformation).c1 = -(float)local_78 * (root->scaling).x;
  (rootOut->mTransformation).a2 = fVar23 * (root->scaling).y;
  (rootOut->mTransformation).b2 = fVar24 * (root->scaling).y;
  (rootOut->mTransformation).c2 = fVar21 * local_80 * (root->scaling).y;
  (rootOut->mTransformation).a3 = (root->scaling).z * (rootOut->mTransformation).a3;
  (rootOut->mTransformation).b3 = (root->scaling).z * (rootOut->mTransformation).b3;
  (rootOut->mTransformation).c3 = (root->scaling).z * (rootOut->mTransformation).c3;
  (rootOut->mTransformation).a4 = (root->position).x + (rootOut->mTransformation).a4;
  (rootOut->mTransformation).b4 = (root->position).y + (rootOut->mTransformation).b4;
  (rootOut->mTransformation).c4 = (root->position).z + (rootOut->mTransformation).c4;
  ComputeAnimations(local_58,root,rootOut,anims);
  uVar12 = (long)(root->children).
                 super__Vector_base<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(root->children).
                 super__Vector_base<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar17 = (uint)(uVar12 >> 3);
  rootOut->mNumChildren = uVar17;
  if (uVar17 != 0) {
    ppaVar13 = (aiNode **)operator_new__(uVar12 & 0x7fffffff8);
    rootOut->mChildren = ppaVar13;
    if (rootOut->mNumChildren != 0) {
      uVar12 = 0;
      do {
        this_00 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(this_00);
        rootOut->mChildren[uVar12] = this_00;
        this_00->mParent = rootOut;
        GenerateGraph(local_58,(root->children).
                               super__Vector_base<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar12],this_00,local_50,
                      local_60,meshes,anims,attach,materials,defMatIdx);
        uVar12 = uVar12 + 1;
      } while (uVar12 < rootOut->mNumChildren);
    }
  }
  return;
}

Assistant:

void IRRImporter::GenerateGraph(Node* root,aiNode* rootOut ,aiScene* scene,
    BatchLoader& batch,
    std::vector<aiMesh*>&        meshes,
    std::vector<aiNodeAnim*>&    anims,
    std::vector<AttachmentInfo>& attach,
    std::vector<aiMaterial*>&    materials,
    unsigned int&                defMatIdx)
{
    unsigned int oldMeshSize = (unsigned int)meshes.size();
    //unsigned int meshTrafoAssign = 0;

    // Now determine the type of the node
    switch (root->type)
    {
    case Node::ANIMMESH:
    case Node::MESH:
        {
            if (!root->meshPath.length())
                break;

            // Get the loaded mesh from the scene and add it to
            // the list of all scenes to be attached to the
            // graph we're currently building
            aiScene* localScene = batch.GetImport(root->id);
            if (!localScene) {
                ASSIMP_LOG_ERROR("IRR: Unable to load external file: " + root->meshPath);
                break;
            }
            attach.push_back(AttachmentInfo(localScene,rootOut));

            // Now combine the material we've loaded for this mesh
            // with the real materials we got from the file. As we
            // don't execute any pp-steps on the file, the numbers
            // should be equal. If they are not, we can impossibly
            // do this  ...
            if (root->materials.size() != (unsigned int)localScene->mNumMaterials)   {
                ASSIMP_LOG_WARN("IRR: Failed to match imported materials "
                    "with the materials found in the IRR scene file");

                break;
            }
            for (unsigned int i = 0; i < localScene->mNumMaterials;++i)  {
                // Delete the old material, we don't need it anymore
                delete localScene->mMaterials[i];

                std::pair<aiMaterial*, unsigned int>& src = root->materials[i];
                localScene->mMaterials[i] = src.first;
            }

            // NOTE: Each mesh should have exactly one material assigned,
            // but we do it in a separate loop if this behaviour changes
            // in future.
            for (unsigned int i = 0; i < localScene->mNumMeshes;++i) {
                // Process material flags
                aiMesh* mesh = localScene->mMeshes[i];


                // If "trans_vertex_alpha" mode is enabled, search all vertex colors
                // and check whether they have a common alpha value. This is quite
                // often the case so we can simply extract it to a shared oacity
                // value.
                std::pair<aiMaterial*, unsigned int>& src = root->materials[mesh->mMaterialIndex];
                aiMaterial* mat = (aiMaterial*)src.first;

                if (mesh->HasVertexColors(0) && src.second & AI_IRRMESH_MAT_trans_vertex_alpha)
                {
                    bool bdo = true;
                    for (unsigned int a = 1; a < mesh->mNumVertices;++a)    {

                        if (mesh->mColors[0][a].a != mesh->mColors[0][a-1].a)   {
                            bdo = false;
                            break;
                        }
                    }
                    if (bdo)    {
                        ASSIMP_LOG_INFO("IRR: Replacing mesh vertex alpha with common opacity");

                        for (unsigned int a = 0; a < mesh->mNumVertices;++a)
                            mesh->mColors[0][a].a = 1.f;

                        mat->AddProperty(& mesh->mColors[0][0].a, 1, AI_MATKEY_OPACITY);
                    }
                }

                // If we have a second texture coordinate set and a second texture
                // (either lightmap, normalmap, 2layered material) we need to
                // setup the correct UV index for it. The texture can either
                // be diffuse (lightmap & 2layer) or a normal map (normal & parallax)
                if (mesh->HasTextureCoords(1))  {

                    int idx = 1;
                    if (src.second & (AI_IRRMESH_MAT_solid_2layer | AI_IRRMESH_MAT_lightmap))   {
                        mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_DIFFUSE(0));
                    }
                    else if (src.second & AI_IRRMESH_MAT_normalmap_solid)   {
                        mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_NORMALS(0));
                    }
                }
            }
        }
        break;

    case Node::LIGHT:
    case Node::CAMERA:

        // We're already finished with lights and cameras
        break;


    case Node::SPHERE:
        {
            // Generate the sphere model. Our input parameter to
            // the sphere generation algorithm is the number of
            // subdivisions of each triangle - but here we have
            // the number of poylgons on a specific axis. Just
            // use some hardcoded limits to approximate this ...
            unsigned int mul = root->spherePolyCountX*root->spherePolyCountY;
            if      (mul < 100)mul = 2;
            else if (mul < 300)mul = 3;
            else               mul = 4;

            meshes.push_back(StandardShapes::MakeMesh(mul,
                &StandardShapes::MakeSphere));

            // Adjust scaling
            root->scaling *= root->sphereRadius/2;

            // Copy one output material
            CopyMaterial(materials, root->materials, defMatIdx, meshes.back());

            // Now adjust this output material - if there is a first texture
            // set, setup spherical UV mapping around the Y axis.
            SetupMapping ( (aiMaterial*) materials.back(), aiTextureMapping_SPHERE);
        }
        break;

    case Node::CUBE:
        {
            // Generate an unit cube first
            meshes.push_back(StandardShapes::MakeMesh(
                &StandardShapes::MakeHexahedron));

            // Adjust scaling
            root->scaling *= root->sphereRadius;

            // Copy one output material
            CopyMaterial(materials, root->materials, defMatIdx, meshes.back());

            // Now adjust this output material - if there is a first texture
            // set, setup cubic UV mapping
            SetupMapping ( (aiMaterial*) materials.back(), aiTextureMapping_BOX );
        }
        break;


    case Node::SKYBOX:
        {
            // A skybox is defined by six materials
            if (root->materials.size() < 6) {
                ASSIMP_LOG_ERROR("IRR: There should be six materials for a skybox");
                break;
            }

            // copy those materials and generate 6 meshes for our new skybox
            materials.reserve(materials.size() + 6);
            for (unsigned int i = 0; i < 6;++i)
                materials.insert(materials.end(),root->materials[i].first);

            BuildSkybox(meshes,materials);

            // *************************************************************
            // Skyboxes will require a different code path for rendering,
            // so there must be a way for the user to add special support
            // for IRR skyboxes. We add a 'IRR.SkyBox_' prefix to the node.
            // *************************************************************
            root->name = "IRR.SkyBox_" + root->name;
            ASSIMP_LOG_INFO("IRR: Loading skybox, this will "
                "require special handling to be displayed correctly");
        }
        break;

    case Node::TERRAIN:
        {
            // to support terrains, we'd need to have a texture decoder
            ASSIMP_LOG_ERROR("IRR: Unsupported node - TERRAIN");
        }
        break;
    default:
        // DUMMY
        break;
    };

    // Check whether we added a mesh (or more than one ...). In this case
    // we'll also need to attach it to the node
    if (oldMeshSize != (unsigned int) meshes.size())    {

        rootOut->mNumMeshes = (unsigned int)meshes.size() - oldMeshSize;
        rootOut->mMeshes    = new unsigned int[rootOut->mNumMeshes];

        for (unsigned int a = 0; a  < rootOut->mNumMeshes;++a)  {
            rootOut->mMeshes[a] = oldMeshSize+a;
        }
    }

    // Setup the name of this node
    rootOut->mName.Set(root->name);

    // Now compute the final local transformation matrix of the
    // node from the given translation, rotation and scaling values.
    // (the rotation is given in Euler angles, XYZ order)
    //std::swap((float&)root->rotation.z,(float&)root->rotation.y);
    rootOut->mTransformation.FromEulerAnglesXYZ(AI_DEG_TO_RAD(root->rotation) );

    // apply scaling
    aiMatrix4x4& mat = rootOut->mTransformation;
    mat.a1 *= root->scaling.x;
    mat.b1 *= root->scaling.x;
    mat.c1 *= root->scaling.x;
    mat.a2 *= root->scaling.y;
    mat.b2 *= root->scaling.y;
    mat.c2 *= root->scaling.y;
    mat.a3 *= root->scaling.z;
    mat.b3 *= root->scaling.z;
    mat.c3 *= root->scaling.z;

    // apply translation
    mat.a4 += root->position.x;
    mat.b4 += root->position.y;
    mat.c4 += root->position.z;

    // now compute animations for the node
    ComputeAnimations(root,rootOut, anims);

    // Add all children recursively. First allocate enough storage
    // for them, then call us again
    rootOut->mNumChildren = (unsigned int)root->children.size();
    if (rootOut->mNumChildren)  {

        rootOut->mChildren = new aiNode*[rootOut->mNumChildren];
        for (unsigned int i = 0; i < rootOut->mNumChildren;++i) {

            aiNode* node = rootOut->mChildren[i] =  new aiNode();
            node->mParent = rootOut;
            GenerateGraph(root->children[i],node,scene,batch,meshes,
                anims,attach,materials,defMatIdx);
        }
    }
}